

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

CompilationUnitSymbol * __thiscall
slang::BumpAllocator::
emplace<slang::ast::CompilationUnitSymbol,slang::ast::Compilation&,slang::SourceLibrary_const&>
          (BumpAllocator *this,Compilation *args,SourceLibrary *args_1)

{
  CompilationUnitSymbol *this_00;
  
  this_00 = (CompilationUnitSymbol *)allocate(this,0xc0,8);
  ast::CompilationUnitSymbol::CompilationUnitSymbol(this_00,args,args_1);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }